

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWvidmode *pGVar2;
  GLFWwindow *window_00;
  GLFWvidmode *mode;
  GLFWwindow *window;
  GLFWmonitor *monitor;
  int local_20;
  int ch;
  int height;
  int width;
  char **argv_local;
  int argc_local;
  
  window = (GLFWwindow *)0x0;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  while (iVar1 = getopt(argc,argv,"fh"), iVar1 != -1) {
    if (iVar1 != 0x66) {
      if (iVar1 != 0x68) {
        usage();
        exit(1);
      }
      usage();
      exit(0);
    }
    window = (GLFWwindow *)glfwGetPrimaryMonitor();
  }
  if (window == (GLFWwindow *)0x0) {
    ch = 200;
    local_20 = 200;
  }
  else {
    pGVar2 = glfwGetVideoMode((GLFWmonitor *)window);
    glfwWindowHint(0x2100f,pGVar2->refreshRate);
    glfwWindowHint(0x21001,pGVar2->redBits);
    glfwWindowHint(0x21002,pGVar2->greenBits);
    glfwWindowHint(0x21003,pGVar2->blueBits);
    ch = pGVar2->width;
    local_20 = pGVar2->height;
  }
  window_00 = glfwCreateWindow(ch,local_20,"Gamma Test",(GLFWmonitor *)window,(GLFWwindow *)0x0);
  if (window_00 != (GLFWwindow *)0x0) {
    set_gamma(window_00,1.0);
    glfwMakeContextCurrent(window_00);
    glfwSwapInterval(1);
    glfwSetKeyCallback(window_00,key_callback);
    glfwSetFramebufferSizeCallback(window_00,framebuffer_size_callback);
    glMatrixMode(0x1701);
    glOrtho(0,0,0,0);
    glMatrixMode(0x1700);
    glClearColor(0x3f000000,0x3f000000,0x3f000000,0);
    while (iVar1 = glfwWindowShouldClose(window_00), iVar1 == 0) {
      glClear(0x4000);
      glColor3f(0x3f4ccccd,0x3e4ccccd,0x3ecccccd);
      glRectf(0xbf000000,0xbf000000,0x3f000000);
      glfwSwapBuffers(window_00);
      glfwWaitEvents();
    }
    glfwTerminate();
    exit(0);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int width, height, ch;
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);
        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 200;
        height = 200;
    }

    window = glfwCreateWindow(width, height, "Gamma Test", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    set_gamma(window, 1.f);

    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

    glMatrixMode(GL_PROJECTION);
    glOrtho(-1.f, 1.f, -1.f, 1.f, -1.f, 1.f);
    glMatrixMode(GL_MODELVIEW);

    glClearColor(0.5f, 0.5f, 0.5f, 0);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        glColor3f(0.8f, 0.2f, 0.4f);
        glRectf(-0.5f, -0.5f, 0.5f, 0.5f);

        glfwSwapBuffers(window);
        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}